

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint *in_RSI;
  long in_RDI;
  YV12_BUFFER_CONFIG sd;
  av1_ref_frame_t *frame;
  long *local_108;
  undefined4 in_stack_ffffffffffffff08;
  uint uVar1;
  undefined4 in_stack_ffffffffffffff14;
  anon_union_8_2_70c94c84_for_yv12_buffer_config_2 in_stack_ffffffffffffff18;
  aom_codec_err_t local_4;
  
  if ((*(byte *)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x42368) & 1) == 0) {
    uVar1 = *in_RSI;
    if (uVar1 < 0x29) {
      local_108 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
      *in_RSI = uVar1 + 8;
    }
    else {
      local_108 = *(long **)(in_RSI + 2);
      *(long **)(in_RSI + 2) = local_108 + 1;
    }
    if (*local_108 == 0) {
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      image2yuvconfig((aom_image_t *)(*local_108 + 8),(YV12_BUFFER_CONFIG *)&stack0xffffffffffffff10
                     );
      av1_copy_reference_enc
                ((AV1_COMP *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                 (YV12_BUFFER_CONFIG *)CONCAT44(uVar1,in_stack_ffffffffffffff08));
      local_4 = AOM_CODEC_OK;
    }
  }
  else {
    local_4 = AOM_CODEC_INCAPABLE;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  if (ctx->ppi->cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return AOM_CODEC_INCAPABLE;
  av1_ref_frame_t *const frame = va_arg(args, av1_ref_frame_t *);

  if (frame != NULL) {
    YV12_BUFFER_CONFIG sd;

    image2yuvconfig(&frame->img, &sd);
    av1_copy_reference_enc(ctx->ppi->cpi, frame->idx, &sd);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}